

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O0

uc_err uc_mem_protect(uc_struct *uc,uint64_t address,size_t size,uint32_t perms)

{
  bool bVar1;
  _Bool _Var2;
  MemoryRegion *pMVar3;
  size_t size_00;
  uint64_t uVar4;
  int __init_ret;
  _Bool remove_exec;
  size_t len;
  size_t count;
  uint64_t pc;
  uint64_t addr;
  MemoryRegion *mr;
  uint32_t perms_local;
  size_t size_local;
  uint64_t address_local;
  uc_struct *uc_local;
  
  bVar1 = false;
  if ((((uc->init_done ^ 0xffU) & 1) == 0) ||
     (uc_local._4_4_ = uc_init_engine(uc), uc_local._4_4_ == UC_ERR_OK)) {
    if (uc->snapshot_level < 1) {
      if (size == 0) {
        uc_local._4_4_ = UC_ERR_OK;
      }
      else if ((address & uc->target_page_align) == 0) {
        if ((size & uc->target_page_align) == 0) {
          if ((perms & 0xfffffff8) == 0) {
            _Var2 = check_mem_area(uc,address,size);
            if (_Var2) {
              pc = address;
              for (len = 0; len < size; len = size_00 + len) {
                pMVar3 = (*uc->memory_mapping)(uc,pc);
                size_00 = memory_region_len(uc,pMVar3,pc,size - len);
                if ((pMVar3->ram & 1U) == 0) {
                  _Var2 = split_mmio_region(uc,pMVar3,pc,size_00,false);
                  if (!_Var2) {
                    return UC_ERR_NOMEM;
                  }
                  pMVar3 = (*uc->memory_mapping)(uc,pc);
                  pMVar3->perms = perms;
                }
                else {
                  _Var2 = split_region(uc,pMVar3,pc,size_00,false);
                  if (!_Var2) {
                    return UC_ERR_NOMEM;
                  }
                  pMVar3 = (*uc->memory_mapping)(uc,pc);
                  if (((pMVar3->perms & 4) != 0) && ((perms & 4) == 0)) {
                    bVar1 = true;
                  }
                  pMVar3->perms = perms;
                  (*uc->readonly_mem)(pMVar3,(perms & 2) == 0);
                }
                pc = size_00 + pc;
              }
              if (((bVar1) && (uVar4 = (*uc->get_pc)(uc), uVar4 < address + size)) &&
                 (address <= uVar4)) {
                uc->quit_request = true;
                uc_emu_stop(uc);
              }
              uc_local._4_4_ = UC_ERR_OK;
            }
            else {
              uc_local._4_4_ = UC_ERR_NOMEM;
            }
          }
          else {
            uc_local._4_4_ = UC_ERR_ARG;
          }
        }
        else {
          uc_local._4_4_ = UC_ERR_ARG;
        }
      }
      else {
        uc_local._4_4_ = UC_ERR_ARG;
      }
    }
    else {
      uc_local._4_4_ = UC_ERR_ARG;
    }
  }
  return uc_local._4_4_;
}

Assistant:

UNICORN_EXPORT
uc_err uc_mem_protect(struct uc_struct *uc, uint64_t address, size_t size,
                      uint32_t perms)
{
    MemoryRegion *mr;
    uint64_t addr = address;
    uint64_t pc;
    size_t count, len;
    bool remove_exec = false;

    UC_INIT(uc);

    // snapshot and protection can't be mixed
    if (uc->snapshot_level > 0) {
        return UC_ERR_ARG;
    }

    if (size == 0) {
        // trivial case, no change
        return UC_ERR_OK;
    }

    // address must be aligned to uc->target_page_size
    if ((address & uc->target_page_align) != 0) {
        return UC_ERR_ARG;
    }

    // size must be multiple of uc->target_page_size
    if ((size & uc->target_page_align) != 0) {
        return UC_ERR_ARG;
    }

    // check for only valid permissions
    if ((perms & ~UC_PROT_ALL) != 0) {
        return UC_ERR_ARG;
    }

    // check that user's entire requested block is mapped
    // TODO check if protected is possible
    // deny after cow
    if (!check_mem_area(uc, address, size)) {
        return UC_ERR_NOMEM;
    }

    // Now we know entire region is mapped, so change permissions
    // We may need to split regions if this area spans adjacent regions
    addr = address;
    count = 0;
    while (count < size) {
        mr = uc->memory_mapping(uc, addr);
        len = memory_region_len(uc, mr, addr, size - count);
        if (mr->ram) {
            if (!split_region(uc, mr, addr, len, false)) {
                return UC_ERR_NOMEM;
            }

            mr = uc->memory_mapping(uc, addr);
            // will this remove EXEC permission?
            if (((mr->perms & UC_PROT_EXEC) != 0) &&
                ((perms & UC_PROT_EXEC) == 0)) {
                remove_exec = true;
            }
            mr->perms = perms;
            uc->readonly_mem(mr, (perms & UC_PROT_WRITE) == 0);

        } else {
            if (!split_mmio_region(uc, mr, addr, len, false)) {
                return UC_ERR_NOMEM;
            }

            mr = uc->memory_mapping(uc, addr);
            mr->perms = perms;
        }

        count += len;
        addr += len;
    }

    // if EXEC permission is removed, then quit TB and continue at the same
    // place
    if (remove_exec) {
        pc = uc->get_pc(uc);
        if (pc < address + size && pc >= address) {
            uc->quit_request = true;
            uc_emu_stop(uc);
        }
    }

    return UC_ERR_OK;
}